

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.cpp
# Opt level: O1

string * __thiscall
bidfx_public_api::price::pixie::FieldDef::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDef *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  long *plVar8;
  ulong *puVar9;
  size_type *psVar10;
  ulong uVar11;
  undefined8 uVar12;
  uint uVar13;
  string __str_1;
  string __str;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined8 uStack_178;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  long *local_150;
  ulong local_148;
  long local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  uVar1 = this->fid_;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar13 = 1;
  if (9 < uVar2) {
    uVar11 = (ulong)uVar2;
    uVar4 = 4;
    do {
      uVar13 = uVar4;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_00180ea1;
      }
      if (uVar7 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_00180ea1;
      }
      if (uVar7 < 10000) goto LAB_00180ea1;
      uVar11 = uVar11 / 10000;
      uVar4 = uVar13 + 4;
    } while (99999 < uVar7);
    uVar13 = uVar13 + 1;
  }
LAB_00180ea1:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar13 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50[0] + (ulong)(uVar1 >> 0x1f)),uVar13,uVar2);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1c160d);
  local_b0 = &local_a0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar5[3];
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_90 = &local_80;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = plVar5[3];
  }
  else {
    local_80 = *plVar8;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(this->name_)._M_dataplus._M_p);
  local_70 = &local_60;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar5[3];
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_1c0 = *puVar9;
    lStack_1b8 = plVar5[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *puVar9;
    local_1d0 = (ulong *)*plVar5;
  }
  local_1c8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  FieldTypeMethods::ToString_abi_cxx11_
            (&local_d0,(FieldTypeMethods *)(ulong)this->type_,(FieldTypeEnum)local_1c8);
  uVar11 = 0xf;
  if (local_1d0 != &local_1c0) {
    uVar11 = local_1c0;
  }
  if (uVar11 < local_d0._M_string_length + local_1c8) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar12 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_d0._M_string_length + local_1c8) goto LAB_001810bc;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_1d0);
  }
  else {
LAB_001810bc:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_d0._M_dataplus._M_p);
  }
  local_190 = &local_180;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_180 = *plVar5;
    uStack_178 = puVar6[3];
  }
  else {
    local_180 = *plVar5;
    local_190 = (long *)*puVar6;
  }
  local_188 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_1a0 = *puVar9;
    lStack_198 = plVar5[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar9;
    local_1b0 = (ulong *)*plVar5;
  }
  local_1a8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  FieldEncodingMethods::ToString_abi_cxx11_
            (&local_f0,(FieldEncodingMethods *)(ulong)this->encoding_,(FieldEncodingEnum)local_1a8);
  uVar11 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar11 = local_1a0;
  }
  if (uVar11 < local_f0._M_string_length + local_1a8) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar12 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_f0._M_string_length + local_1a8) goto LAB_001811db;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_001811db:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_f0._M_dataplus._M_p);
  }
  local_170 = &local_160;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_160 = *plVar5;
    uStack_158 = puVar6[3];
  }
  else {
    local_160 = *plVar5;
    local_170 = (long *)*puVar6;
  }
  local_168 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_100 = *puVar9;
    lStack_f8 = plVar5[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar9;
    local_110 = (ulong *)*plVar5;
  }
  local_108 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar1 = this->scale_;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar13 = 1;
  if (9 < uVar2) {
    uVar11 = (ulong)uVar2;
    uVar4 = 4;
    do {
      uVar13 = uVar4;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0018130c;
      }
      if (uVar7 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0018130c;
      }
      if (uVar7 < 10000) goto LAB_0018130c;
      uVar11 = uVar11 / 10000;
      uVar4 = uVar13 + 4;
    } while (99999 < uVar7);
    uVar13 = uVar13 + 1;
  }
LAB_0018130c:
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,(char)uVar13 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_130),uVar13,uVar2);
  uVar11 = 0xf;
  if (local_110 != &local_100) {
    uVar11 = local_100;
  }
  if (uVar11 < (ulong)(local_128 + local_108)) {
    uVar11 = 0xf;
    if (local_130 != local_120) {
      uVar11 = local_120[0];
    }
    if ((ulong)(local_128 + local_108) <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_110);
      goto LAB_001813bf;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_130);
LAB_001813bf:
  local_150 = &local_140;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_140 = *plVar5;
    uStack_138 = puVar6[3];
  }
  else {
    local_140 = *plVar5;
    local_150 = (long *)*puVar6;
  }
  local_148 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_150,local_148,0,'\x01');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar10) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDef::ToString() const
{
    return std::string("fieldDef(FID=" + std::to_string(fid_) +
                       ", name=\"" + name_ + "\", type=" + FieldTypeMethods::ToString(type_) + ", encoding="
                       + FieldEncodingMethods::ToString(encoding_) + ", scale=" + std::to_string(scale_) + ')'
    );
}